

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

Maybe<kj::StringTree> * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepInitializer
          (Maybe<kj::StringTree> *__return_storage_ptr__,CapnpcCppMain *this,Method method,
          StructSchema type,StringPtr suffix)

{
  size_t sVar1;
  undefined8 uVar2;
  Maybe<kj::_::Mutex::Waiter_&> MVar3;
  Branch *pBVar4;
  Impl *pIVar5;
  Filesystem *pFVar6;
  Waiter *pWVar7;
  Schema SVar8;
  undefined8 uVar9;
  char *pcVar10;
  CapnpcCppMain *this_00;
  StringPtr SVar11;
  StringPtr name_00;
  StringPtr innerName;
  CppTypeName name;
  Reader typeProto;
  Schema local_180;
  String local_178;
  Maybe<capnp::InterfaceSchema::Method> local_158;
  undefined1 local_108 [8];
  char *local_100;
  Maybe<kj::_::Mutex::Waiter_&> MStack_f8;
  ArrayDisposer *local_f0;
  Branch *pBStack_e8;
  Impl *local_e0;
  ArrayDisposer *pAStack_d8;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  Reader local_c8;
  Disposer *local_98;
  Filesystem *local_90;
  Waiter *pWStack_88;
  ArrayDisposer *local_80;
  Branch *pBStack_78;
  Impl *local_70;
  ArrayDisposer *pAStack_68;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  ArrayPtr<const_char> local_58;
  PointerReader local_48;
  
  local_180 = type.super_Schema.raw;
  Schema::getProto(&local_c8,&local_180);
  if ((local_c8._reader.dataSize < 0xc0) || (*(long *)((long)local_c8._reader.data + 0x10) == 0)) {
    local_158.ptr._0_8_ = local_158.ptr._0_8_ & 0xffffffffffffff00;
    this_00 = (CapnpcCppMain *)local_108;
    SVar8 = method.parent.super_Schema.raw;
    cppFullName((CppTypeName *)this_00,this,method.parent.super_Schema.raw,
                method.parent.super_Schema.raw,&local_158);
    SVar11 = protoName<capnp::schema::Method::Reader>(this_00,method.proto._reader);
    name_00.content.ptr = (char *)SVar11.content.size_;
    name_00.content.size_ = (size_t)SVar8.raw;
    toTitleCase((String *)&local_158,(CapnpcCppMain *)SVar11.content.ptr,name_00);
    local_48.segment = (SegmentReader *)local_158.ptr.field_1.value.parent.super_Schema.raw;
    if ((Schema)local_158.ptr.field_1.value.parent.super_Schema.raw != (Schema)0x0) {
      local_48.segment = (SegmentReader *)local_158.ptr._0_8_;
    }
    local_48.capTable = (CapTableReader *)0x0;
    if ((Schema)local_158.ptr.field_1.value.parent.super_Schema.raw != (Schema)0x0) {
      local_48.capTable =
           (CapTableReader *)((long)local_158.ptr.field_1.value.parent.super_Schema.raw + -1);
    }
    local_58.size_ = suffix.content.size_ - 1;
    local_58.ptr = suffix.content.ptr;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_178,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)local_48.segment);
    uVar9 = local_158.ptr.field_1.value.parent.super_Schema.raw;
    uVar2 = local_158.ptr._0_8_;
    if ((CppTypeName *)local_158.ptr._0_8_ != (CppTypeName *)0x0) {
      local_158.ptr._0_8_ = (CppTypeName *)0x0;
      local_158.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      (*(code *)**(undefined8 **)local_158.ptr.field_1._8_8_)
                (local_158.ptr.field_1._8_8_,uVar2,1,uVar9,uVar9,0);
    }
    if (local_c8._reader.pointerCount < 6) {
      local_c8._reader.nestingLimit = 0x7fffffff;
      local_c8._reader.capTable = (CapTableReader *)0x0;
      local_48.pointer = (WirePointer *)0x0;
      local_c8._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_48.pointer = local_c8._reader.pointers + 5;
    }
    SVar8.raw = (RawBrandedSchema *)0x0;
    local_48.segment = local_c8._reader.segment;
    local_48.capTable = local_c8._reader.capTable;
    local_48.nestingLimit = local_c8._reader.nestingLimit;
    _::PointerReader::getList((ListReader *)&local_158,&local_48,INLINE_COMPOSITE,(word *)0x0);
    pcVar10 = local_178.content.ptr;
    if (local_178.content.size_ == 0) {
      pcVar10 = "";
    }
    SVar11.content.size_ = local_178.content.size_ + (local_178.content.size_ == 0);
    if (local_158.ptr.field_1._16_4_ == 0) {
      innerName.content.size_ = SVar11.content.size_;
      innerName.content.ptr = pcVar10;
      CppTypeName::addMemberType((CppTypeName *)local_108,innerName);
    }
    else {
      SVar8.raw = (RawBrandedSchema *)&local_158;
      local_158.ptr._0_8_ = (CppTypeName *)0x0;
      local_158.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      local_158.ptr.field_1._8_8_ = (undefined8 *)0x0;
      SVar11.content.ptr = pcVar10;
      CppTypeName::addMemberTemplate
                ((CppTypeName *)local_108,SVar11,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)SVar8.raw);
      uVar9 = local_158.ptr.field_1.value.parent.super_Schema.raw;
      uVar2 = local_158.ptr._0_8_;
      if ((CppTypeName *)local_158.ptr._0_8_ != (CppTypeName *)0x0) {
        local_158.ptr._0_8_ = (CppTypeName *)0x0;
        local_158.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
        (*(code *)**(undefined8 **)local_158.ptr.field_1._8_8_)
                  (local_158.ptr.field_1._8_8_,uVar2,0x40,uVar9,uVar9,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
        SVar8.raw = (RawBrandedSchema *)uVar9;
      }
    }
    local_98 = (Disposer *)local_108;
    local_90 = (Filesystem *)local_100;
    pWStack_88 = MStack_f8.ptr;
    local_80 = local_f0;
    pBStack_78 = pBStack_e8;
    local_100 = (char *)0x0;
    MStack_f8.ptr = (Waiter *)0x0;
    local_70 = local_e0;
    pAStack_68 = pAStack_d8;
    pBStack_e8 = (Branch *)0x0;
    local_e0 = (Impl *)0x0;
    local_60 = local_d0;
    bStack_5f = bStack_cf;
    bStack_5e = bStack_ce;
    bStack_5d = bStack_cd;
    makeBrandDepInitializer
              (__return_storage_ptr__,(CapnpcCppMain *)local_180.raw,(RawBrandedSchema *)&local_98,
               (CppTypeName *)SVar8.raw);
    pIVar5 = local_70;
    pBVar4 = pBStack_78;
    if (pBStack_78 != (Branch *)0x0) {
      pBStack_78 = (Branch *)0x0;
      local_70 = (Impl *)0x0;
      (*(code *)((__node_base_ptr)pAStack_68->_vptr_ArrayDisposer)->_M_nxt)
                (pAStack_68,pBVar4,0x40,pIVar5,pIVar5,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pWVar7 = pWStack_88;
    pFVar6 = local_90;
    if (local_90 != (Filesystem *)0x0) {
      local_90 = (Filesystem *)0x0;
      pWStack_88 = (Waiter *)0x0;
      (*(code *)(((Waiter *)local_80->_vptr_ArrayDisposer)->next).ptr)
                (local_80,pFVar6,1,pWVar7,pWVar7,0);
    }
    sVar1 = local_178.content.size_;
    pcVar10 = local_178.content.ptr;
    if (local_178.content.ptr != (char *)0x0) {
      local_178.content.ptr = (char *)0x0;
      local_178.content.size_ = 0;
      (**(local_178.content.disposer)->_vptr_ArrayDisposer)
                (local_178.content.disposer,pcVar10,1,sVar1,sVar1,0);
    }
    pIVar5 = local_e0;
    pBVar4 = pBStack_e8;
    if (pBStack_e8 != (Branch *)0x0) {
      pBStack_e8 = (Branch *)0x0;
      local_e0 = (Impl *)0x0;
      (*(code *)((__node_base_ptr)pAStack_d8->_vptr_ArrayDisposer)->_M_nxt)
                (pAStack_d8,pBVar4,0x40,pIVar5,pIVar5,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    MVar3.ptr = MStack_f8.ptr;
    pcVar10 = local_100;
    if (local_100 != (char *)0x0) {
      local_100 = (char *)0x0;
      MStack_f8.ptr = (Waiter *)0x0;
      (*(code *)(((Waiter *)local_f0->_vptr_ArrayDisposer)->next).ptr)
                (local_f0,pcVar10,1,MVar3.ptr,MVar3.ptr,0);
    }
  }
  else {
    makeBrandDepInitializer(__return_storage_ptr__,this,local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::StringTree> makeBrandDepInitializer(
      InterfaceSchema::Method method, StructSchema type, kj::StringPtr suffix) {
    auto typeProto = type.getProto();
    if (typeProto.getScopeId() == 0) {
      // This is an auto-generated params or results type.
      auto name = cppFullName(method.getContainingInterface(), nullptr);
      auto memberTypeName = kj::str(toTitleCase(protoName(method.getProto())), suffix);

      if (typeProto.getParameters().size() == 0) {
        name.addMemberType(memberTypeName);
      } else {
        // The method has implicit parameters (i.e. it's generic). For the purpose of the brand
        // dep initializer, we only want to supply the default AnyPointer variant, so just don't
        // pass any parameters here.
        name.addMemberTemplate(memberTypeName, nullptr);
      }
      return makeBrandDepInitializer(type, kj::mv(name));
    } else {
      return makeBrandDepInitializer(type);
    }
  }